

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall QMenuBarPrivate::_q_internalShortcutActivated(QMenuBarPrivate *this,int id)

{
  QWidget *this_00;
  QAction *action;
  Data *pDVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  QMenu *this_01;
  QPlatformMenu *pQVar5;
  QWindow *pQVar6;
  QWidget *pQVar7;
  Data *pDVar8;
  QStyle *pQVar9;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  action = (this->super_QWidgetPrivate).actions.d.ptr[id];
  if (action == (QAction *)0x0) {
    pQVar7 = QApplication::focusWidget();
    if (pQVar7 == (QWidget *)0x0) {
      pDVar8 = (Data *)0x0;
    }
    else {
      pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar7->super_QObject);
    }
    pDVar1 = (this->keyboardFocusWidget).wp.d;
    (this->keyboardFocusWidget).wp.d = pDVar8;
    (this->keyboardFocusWidget).wp.value = &pQVar7->super_QObject;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    setCurrentAction(this,(QAction *)0x0,true,true);
  }
  else {
    QAction::menuObject();
    lVar4 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar4 != 0) {
      QAction::menuObject();
      this_01 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      pQVar5 = QMenu::platformMenu(this_01);
      if (pQVar5 != (QPlatformMenu *)0x0) {
        pQVar6 = QWidget::windowHandle(this_00);
        (**(code **)(*(long *)pQVar5 + 0xd0))
                  (pQVar5,pQVar6,(this->actionRects).d.ptr + id,0,*(code **)(*(long *)pQVar5 + 0xd0)
                  );
        return;
      }
    }
    pQVar7 = QApplication::focusWidget();
    if (pQVar7 == (QWidget *)0x0) {
      pDVar8 = (Data *)0x0;
    }
    else {
      pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar7->super_QObject);
    }
    pDVar1 = (this->keyboardFocusWidget).wp.d;
    (this->keyboardFocusWidget).wp.d = pDVar8;
    (this->keyboardFocusWidget).wp.value = &pQVar7->super_QObject;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    setCurrentAction(this,action,true,true);
    QAction::menuObject();
    lVar4 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar4 == 0) {
      cVar2 = QAction::isEnabled();
      if (cVar2 != '\0') {
        QAction::activate((ActionEvent)action);
      }
      QBasicTimer::start(&this->autoReleaseTimer,100000000,1,this_00);
      return;
    }
  }
  if (action != (QAction *)0x0) {
    pQVar9 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x12,0,this_00,0);
    if (iVar3 != 0) {
      setKeyboardMode(this,true);
      return;
    }
  }
  return;
}

Assistant:

void QMenuBarPrivate::_q_internalShortcutActivated(int id)
{
    Q_Q(QMenuBar);
    QAction *act = actions.at(id);
    if (act && act->menu()) {
        if (QPlatformMenu *platformMenu = act->menu()->platformMenu()) {
            platformMenu->showPopup(q->windowHandle(), actionRects.at(id), nullptr);
            return;
        }
    }

    keyboardFocusWidget = QApplication::focusWidget();
    setCurrentAction(act, true, true);
    if (act && !act->menu()) {
        activateAction(act, QAction::Trigger);
        //100 is the same as the default value in QPushButton::animateClick
        autoReleaseTimer.start(100, q);
    } else if (act && q->style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, q)) {
        // When we open a menu using a shortcut, we should end up in keyboard state
        setKeyboardMode(true);
    }
}